

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

reentrant_put_transaction<void> *
density_tests::detail::
PutUInt8<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  reentrant_put_transaction<unsigned_char> local_68;
  undefined1 local_48 [8];
  reentrant_put_transaction<unsigned_char> transaction;
  ElementType val;
  EasyRandom *param_1_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *i_queue_local;
  
  transaction.m_put_transaction.m_put_data.m_user_storage._7_1_ = 8;
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_reentrant_push<unsigned_char&>
            (&local_68,
             (conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             i_queue,(uchar *)((long)&transaction.m_put_transaction.m_put_data.m_user_storage + 7));
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<unsigned_char>::reentrant_put_transaction<unsigned_char,void>
            ((reentrant_put_transaction<unsigned_char> *)local_48,&local_68);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction(&local_68);
  exception_checkpoint();
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::reentrant_put_transaction<unsigned_char,void>
            ((reentrant_put_transaction<void> *)__return_storage_ptr__,
             (reentrant_put_transaction<unsigned_char> *)local_48);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction
            ((reentrant_put_transaction<unsigned_char> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                ElementType val         = 8;
                auto        transaction = i_queue.start_reentrant_push(val);
                exception_checkpoint();
                return std::move(transaction);
            }